

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuUpdate.c
# Opt level: O3

void Fxu_UpdateCleanOldSingles(Fxu_Matrix *p)

{
  Fxu_Single *pFVar1;
  Fxu_Single *pSingle;
  int iVar2;
  
  pFVar1 = (p->lSingles).pHead;
  while (pSingle = pFVar1, pSingle != (Fxu_Single *)0x0) {
    pFVar1 = pSingle->pNext;
    if ((pSingle->pVar1->pOrder != (Fxu_Var *)0x0) || (pSingle->pVar2->pOrder != (Fxu_Var *)0x0)) {
      iVar2 = Fxu_SingleCountCoincidence(p,pSingle->pVar1,pSingle->pVar2);
      if (iVar2 < 2) {
        Fxu_HeapSingleDelete(p->pHeapSingle,pSingle);
        Fxu_ListMatrixDelSingle(p,pSingle);
        Fxu_MemRecycle(p,(char *)pSingle,0x30);
      }
      else {
        pSingle->Weight = iVar2 + -2;
        Fxu_HeapSingleUpdate(p->pHeapSingle,pSingle);
      }
    }
  }
  return;
}

Assistant:

void Fxu_UpdateCleanOldSingles( Fxu_Matrix * p )
{ 
    Fxu_Single * pSingle, * pSingle2;
    int WeightNew;
    int Counter = 0;

    Fxu_MatrixForEachSingleSafe( p, pSingle, pSingle2 )
    {
        // if at least one of the variables is marked, recalculate
        if ( pSingle->pVar1->pOrder || pSingle->pVar2->pOrder )
        {
            Counter++;
            // get the new weight
            WeightNew = -2 + Fxu_SingleCountCoincidence( p, pSingle->pVar1, pSingle->pVar2 );
            if ( WeightNew >= 0 )
            {
                pSingle->Weight = WeightNew;
                Fxu_HeapSingleUpdate( p->pHeapSingle, pSingle );
            }
            else
            {
                Fxu_HeapSingleDelete( p->pHeapSingle, pSingle );
                Fxu_ListMatrixDelSingle( p, pSingle );
                MEM_FREE_FXU( p, Fxu_Single, 1, pSingle );
            }
        }
    }
//    printf( "Called procedure %d times.\n", Counter );
}